

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlangs.c
# Opt level: O3

double zlangs(char *norm,SuperMatrix *A)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  void *__s;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  doublecomplex *pdVar12;
  uint uVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  char msg [256];
  char local_138 [264];
  
  iVar5 = A->nrow;
  iVar4 = A->ncol;
  iVar3 = iVar4;
  if (iVar5 < iVar4) {
    iVar3 = iVar5;
  }
  dVar15 = 0.0;
  if (iVar3 == 0) {
    return 0.0;
  }
  pvVar1 = A->Store;
  lVar2 = *(long *)((long)pvVar1 + 8);
  switch(*norm) {
  case 'E':
  case 'F':
    pcVar8 = "Not implemented.";
    uVar6 = 0x75;
    goto LAB_0010ff0a;
  case 'I':
    __s = superlu_malloc((long)iVar5 << 3);
    if (__s == (void *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork.",0x67,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zlangs.c");
      superlu_abort_and_exit(local_138);
    }
    uVar13 = A->nrow;
    if (0 < (long)(int)uVar13) {
      memset(__s,0,(long)(int)uVar13 * 8);
    }
    iVar5 = A->ncol;
    if (0 < iVar5) {
      lVar9 = *(long *)((long)pvVar1 + 0x18);
      lVar11 = 0;
      do {
        iVar4 = *(int *)(lVar9 + lVar11 * 4);
        lVar14 = (long)iVar4;
        lVar10 = lVar11 + 1;
        if (iVar4 < *(int *)(lVar9 + 4 + lVar11 * 4)) {
          pdVar12 = (doublecomplex *)(lVar14 * 0x10 + lVar2);
          do {
            lVar9 = (long)*(int *)(*(long *)((long)pvVar1 + 0x10) + lVar14 * 4);
            dVar15 = z_abs(pdVar12);
            *(double *)((long)__s + lVar9 * 8) = dVar15 + *(double *)((long)__s + lVar9 * 8);
            lVar14 = lVar14 + 1;
            lVar9 = *(long *)((long)pvVar1 + 0x18);
            pdVar12 = pdVar12 + 1;
          } while (lVar14 < *(int *)(lVar9 + lVar10 * 4));
          iVar5 = A->ncol;
        }
        lVar11 = lVar10;
      } while (lVar10 < iVar5);
      uVar13 = A->nrow;
    }
    if ((int)uVar13 < 1) {
      dVar15 = 0.0;
    }
    else {
      dVar15 = 0.0;
      uVar7 = 0;
      do {
        dVar17 = *(double *)((long)__s + uVar7 * 8);
        if (dVar15 <= dVar17) {
          dVar15 = dVar17;
        }
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
    superlu_free(__s);
    break;
  case 'M':
    if (0 < iVar4) {
      lVar9 = *(long *)((long)pvVar1 + 0x18);
      dVar15 = 0.0;
      lVar11 = 0;
      do {
        iVar5 = *(int *)(lVar9 + lVar11 * 4);
        lVar10 = (long)iVar5;
        lVar14 = lVar11 + 1;
        if (iVar5 < *(int *)(lVar9 + 4 + lVar11 * 4)) {
          pdVar12 = (doublecomplex *)(lVar10 * 0x10 + lVar2);
          do {
            dVar17 = z_abs(pdVar12);
            if (dVar15 <= dVar17) {
              dVar15 = z_abs(pdVar12);
            }
            lVar10 = lVar10 + 1;
            lVar9 = *(long *)((long)pvVar1 + 0x18);
            pdVar12 = pdVar12 + 1;
          } while (lVar10 < *(int *)(lVar9 + lVar14 * 4));
          iVar4 = A->ncol;
        }
        lVar11 = lVar14;
      } while (lVar14 < iVar4);
    }
    break;
  case 'O':
switchD_0010fe3b_caseD_4f:
    if (0 < iVar4) {
      lVar9 = *(long *)((long)pvVar1 + 0x18);
      dVar15 = 0.0;
      lVar11 = 0;
      do {
        iVar5 = *(int *)(lVar9 + lVar11 * 4);
        lVar10 = (long)iVar5;
        lVar14 = lVar11 + 1;
        dVar17 = 0.0;
        if (iVar5 < *(int *)(lVar9 + 4 + lVar11 * 4)) {
          pdVar12 = (doublecomplex *)(lVar10 * 0x10 + lVar2);
          do {
            dVar16 = z_abs(pdVar12);
            dVar17 = dVar17 + dVar16;
            lVar10 = lVar10 + 1;
            lVar9 = *(long *)((long)pvVar1 + 0x18);
            pdVar12 = pdVar12 + 1;
          } while (lVar10 < *(int *)(lVar9 + lVar14 * 4));
          iVar4 = A->ncol;
        }
        if (dVar15 <= dVar17) {
          dVar15 = dVar17;
        }
        lVar11 = lVar14;
      } while (lVar14 < iVar4);
    }
    break;
  default:
    if (*norm == '1') goto switchD_0010fe3b_caseD_4f;
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'L':
  case 'N':
    pcVar8 = "Illegal norm specified.";
    uVar6 = 0x77;
LAB_0010ff0a:
    sprintf(local_138,"%s at line %d in file %s\n",pcVar8,uVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zlangs.c");
    superlu_abort_and_exit(local_138);
    dVar15 = 0.0;
  }
  return dVar15;
}

Assistant:

double zlangs(char *norm, SuperMatrix *A)
{
    
    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    int      i, j, irow;
    double   value = 0., sum;
    double   *rwork;

    Astore = A->Store;
    Aval   = Astore->nzval;
    
    if ( SUPERLU_MIN(A->nrow, A->ncol) == 0) {
    } else if (strncmp(norm, "M", 1)==0) {
	/* Find max(abs(A(i,j))). */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++)
		value = SUPERLU_MAX( value, z_abs( &Aval[i]) );
	
    } else if (strncmp(norm, "O", 1)==0 || *(unsigned char *)norm == '1') {
	/* Find norm1(A). */
	for (j = 0; j < A->ncol; ++j) {
	    sum = 0.;
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) 
		sum += z_abs( &Aval[i] );
	    value = SUPERLU_MAX(value,sum);
	}
	
    } else if (strncmp(norm, "I", 1)==0) {
	/* Find normI(A). */
	if ( !(rwork = (double *) SUPERLU_MALLOC(A->nrow * sizeof(double))) )
	    ABORT("SUPERLU_MALLOC fails for rwork.");
	for (i = 0; i < A->nrow; ++i) rwork[i] = 0.;
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; i++) {
		irow = Astore->rowind[i];
		rwork[irow] += z_abs( &Aval[i] );
	    }
	for (i = 0; i < A->nrow; ++i)
	    value = SUPERLU_MAX(value, rwork[i]);
	
	SUPERLU_FREE (rwork);
	
    } else if (strncmp(norm, "F", 1)==0 || strncmp(norm, "E", 1)==0) {
	/* Find normF(A). */
	ABORT("Not implemented.");
    } else
	ABORT("Illegal norm specified.");

    return (value);

}